

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture3D_GL.cpp
# Opt level: O3

void __thiscall
Diligent::Texture3D_GL::Texture3D_GL
          (Texture3D_GL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,TextureData *pInitData,bool bIsDeviceInternal
          )

{
  GLTextureObj *TexObj;
  Uint32 UVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  GLenum local_5c;
  GLenum err;
  GLTextureCreateReleaseHelper GStack_54;
  UniqueIdHelper<GLObjectWrappers::GLTextureCreateReleaseHelper> local_50;
  Uint32 local_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *local_38;
  
  TextureBaseGL::TextureBaseGL
            (&this->super_TextureBaseGL,pRefCounters,TexViewObjAllocator,pDeviceGL,TexDesc,0x806f,
             pInitData,bIsDeviceInternal);
  (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture = (ITexture)&PTR_QueryInterface_00428388;
  if (TexDesc->Usage != USAGE_STAGING) {
    TexObj = &(this->super_TextureBaseGL).m_GlTexture;
    GLContextState::BindTexture(GLState,-1,(this->super_TextureBaseGL).m_BindTarget,TexObj);
    (*__glewTexStorage3D)
              ((this->super_TextureBaseGL).m_BindTarget,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.MipLevels,(this->super_TextureBaseGL).m_GLTexFormat,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.Width,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.Height,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.field_3.ArraySize);
    err = glGetError();
    if (err != 0) {
      LogError<true,char[46],char[17],unsigned_int>
                (false,"Texture3D_GL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture3D_GL.cpp"
                 ,0x46,(char (*) [46])"Failed to allocate storage for the 3D texture",
                 (char (*) [17])"\nGL Error Code: ",&err);
    }
    TextureBaseGL::SetDefaultGLParameters(&this->super_TextureBaseGL);
    local_38 = TexObj;
    if ((pInitData != (TextureData *)0x0) && (pInitData->pSubResources != (TextureSubResData *)0x0))
    {
      UVar1 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
              super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
              .m_Desc.MipLevels;
      if (UVar1 == pInitData->NumSubresources) {
        if (UVar1 != 0) {
          lVar5 = 0;
          uVar6 = 0;
          do {
            bVar2 = (byte)uVar6;
            uVar3 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                    super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                    .m_Desc.Width >> (bVar2 & 0x1f);
            uVar4 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                    super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                    .m_Desc.Height >> (bVar2 & 0x1f);
            local_4c = uVar4 + (uVar4 == 0);
            uVar4 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                    super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                    .m_Desc.field_3.ArraySize >> (bVar2 & 0x1f);
            local_48._M_allocated_capacity._4_4_ = uVar4 + (uVar4 == 0);
            _err = (pointer)((ulong)(uVar3 + (uVar3 == 0)) << 0x20);
            local_50.m_ID = 0;
            local_48._M_allocated_capacity._0_4_ = 0;
            UpdateData(this,GLState,(Uint32)uVar6,0,(Box *)&err,
                       (TextureSubResData *)((long)&pInitData->pSubResources->pData + lVar5));
            uVar6 = uVar6 + 1;
            lVar5 = lVar5 + 0x28;
          } while (uVar6 < (this->super_TextureBaseGL).
                           super_TextureBase<Diligent::EngineGLImplTraits>.
                           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                           .m_Desc.MipLevels);
        }
      }
      else {
        FormatString<char[33]>((string *)&err,(char (*) [33])"Incorrect number of subresources");
        DebugAssertionFailed
                  (_err,"Texture3D_GL",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture3D_GL.cpp"
                   ,100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_err != &local_48) {
          operator_delete(_err,CONCAT44(local_48._M_allocated_capacity._4_4_,
                                        local_48._M_allocated_capacity._0_4_) + 1);
        }
      }
    }
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::SetName
              (local_38,(this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.super_DeviceObjectAttribs.Name);
    _err = (pointer)0x0;
    local_50.m_ID = 0;
    GLContextState::BindTexture
              (GLState,-1,(this->super_TextureBaseGL).m_BindTarget,(GLTextureObj *)&err);
    if (err != 0) {
      local_5c = err;
      if (GStack_54.m_ExternalGLTextureHandle == 0) {
        glDeleteTextures(1,&local_5c);
      }
    }
  }
  return;
}

Assistant:

Texture3D_GL::Texture3D_GL(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& TexViewObjAllocator,
                           RenderDeviceGLImpl*        pDeviceGL,
                           GLContextState&            GLState,
                           const TextureDesc&         TexDesc,
                           const TextureData*         pInitData /*= TextureData()*/,
                           bool                       bIsDeviceInternal /*= false*/) :
    // clang-format off
    TextureBaseGL
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        GL_TEXTURE_3D,
        pInitData,
        bIsDeviceInternal
    }
// clang-format on
{
    if (TexDesc.Usage == USAGE_STAGING)
    {
        // We will use PBO initialized by TextureBaseGL
        return;
    }

    GLState.BindTexture(-1, m_BindTarget, m_GlTexture);

    //                             levels             format          width        height          depth
    glTexStorage3D(m_BindTarget, m_Desc.MipLevels, m_GLTexFormat, m_Desc.Width, m_Desc.Height, m_Desc.Depth);
    DEV_CHECK_GL_ERROR_AND_THROW("Failed to allocate storage for the 3D texture");
    // When target is GL_TEXTURE_3D, calling glTexStorage3D is equivalent to the following pseudo-code:
    //for (i = 0; i < levels; i++)
    //{
    //    glTexImage3D(target, i, internalformat, width, height, depth, 0, format, type, NULL);
    //    width = max(1, (width / 2));
    //    height = max(1, (height / 2));
    //    depth = max(1, (depth / 2));
    //

    SetDefaultGLParameters();

    if (pInitData != nullptr && pInitData->pSubResources != nullptr)
    {
        if (m_Desc.MipLevels == pInitData->NumSubresources)
        {
            for (Uint32 Mip = 0; Mip < m_Desc.MipLevels; ++Mip)
            {
                Box DstBox{0, std::max(m_Desc.Width >> Mip, 1U),
                           0, std::max(m_Desc.Height >> Mip, 1U),
                           0, std::max(m_Desc.Depth >> Mip, 1U)};
                // UpdateData() is a virtual function. If we try to call it through vtbl from here,
                // we will get into TextureBaseGL::UpdateData(), because instance of Texture3D_GL
                // is not fully constructed yet.
                // To call the required function, we need to explicitly specify the class:
                Texture3D_GL::UpdateData(GLState, Mip, 0, DstBox, pInitData->pSubResources[Mip]);
            }
        }
        else
        {
            UNEXPECTED("Incorrect number of subresources");
        }
    }

    m_GlTexture.SetName(m_Desc.Name);

    GLState.BindTexture(-1, m_BindTarget, GLObjectWrappers::GLTextureObj::Null());
}